

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::ktx_texture::get_key_value_as_string(ktx_texture *this,char *pKey,dynamic_string *str)

{
  uint uVar1;
  uint8_vec *puVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  uint buf_size;
  
  puVar2 = find_key(this,pKey);
  if (puVar2 == (uint8_vec *)0x0) {
    dynamic_string::clear(str);
  }
  else {
    sVar3 = strlen(pKey);
    uVar1 = (int)sVar3 + 1;
    buf_size = 0;
    iVar5 = puVar2->m_size - uVar1;
    if (iVar5 != 0) {
      buf_size = iVar5 + (uint)(iVar5 == 0);
      lVar4 = 0;
      do {
        if ((puVar2->m_p + uVar1)[lVar4] == '\0') {
          buf_size = (uint)lVar4;
          break;
        }
        lVar4 = lVar4 + 1;
      } while (iVar5 + (uint)(iVar5 == 0) != (int)lVar4);
    }
    dynamic_string::set_from_buf(str,puVar2->m_p + uVar1,buf_size);
  }
  return puVar2 != (uint8_vec *)0x0;
}

Assistant:

bool ktx_texture::get_key_value_as_string(const char* pKey, dynamic_string& str) const
    {
        const uint8_vec* p = find_key(pKey);
        if (!p)
        {
            str.clear();
            return false;
        }

        const uint ofs = (static_cast<uint>(strlen(pKey)) + 1);
        const uint8* pValue = p->get_ptr() + ofs;
        const uint n = p->size() - ofs;

        uint i;
        for (i = 0; i < n; i++)
        {
            if (!pValue[i])
            {
                break;
            }
        }

        str.set_from_buf(pValue, i);
        return true;
    }